

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbol.cpp
# Opt level: O1

Var Js::JavascriptSymbol::EntrySymbolToPrimitive(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  JavascriptSymbolObject *this;
  int in_stack_00000010;
  undefined1 local_38 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                ,0xb9,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d33a6b;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_38 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_38,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                ,0xbc,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00d33a6b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pvVar5 = Arguments::operator[]((Arguments *)local_38,0);
  bVar3 = VarIs<Js::JavascriptSymbol>(pvVar5);
  pvVar5 = Arguments::operator[]((Arguments *)local_38,0);
  if (!bVar3) {
    bVar3 = VarIs<Js::JavascriptSymbolObject>(pvVar5);
    if (!bVar3) {
      JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ea1a,L"Symbol[Symbol.toPrimitive]");
    }
    pvVar5 = Arguments::operator[]((Arguments *)local_38,0);
    this = VarTo<Js::JavascriptSymbolObject>(pvVar5);
    pvVar5 = JavascriptSymbolObject::Unwrap(this);
    pvVar5 = CrossSite::MarshalVar
                       (pSVar1,pvVar5,
                        (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                          javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
  }
  return pvVar5;
}

Assistant:

Var JavascriptSymbol::EntrySymbolToPrimitive(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (VarIs<JavascriptSymbol>(args[0]))
        {
            return args[0];
        }
        else if (VarIs<JavascriptSymbolObject>(args[0]))
        {
            JavascriptSymbolObject* obj = VarTo<JavascriptSymbolObject>(args[0]);
            return CrossSite::MarshalVar(scriptContext, obj->Unwrap(), obj->GetScriptContext());
        }
        else
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedSymbol, _u("Symbol[Symbol.toPrimitive]"));
        }
    }